

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsCell.cpp
# Opt level: O1

void __thiscall
KDReports::Cell::addElement(Cell *this,Element *element,AlignmentFlag horizontalAlignment)

{
  CellPrivate *this_00;
  int iVar1;
  undefined4 extraout_var;
  ElementData local_28;
  
  this_00 = (this->d)._M_t.
            super___uniq_ptr_impl<KDReports::CellPrivate,_std::default_delete<KDReports::CellPrivate>_>
            ._M_t.
            super__Tuple_impl<0UL,_KDReports::CellPrivate_*,_std::default_delete<KDReports::CellPrivate>_>
            .super__Head_base<0UL,_KDReports::CellPrivate_*,_false>._M_head_impl;
  iVar1 = (*element->_vptr_Element[3])(element);
  local_28.m_element = (Element *)CONCAT44(extraout_var,iVar1);
  local_28._8_1_ = (local_28._8_1_ & 0xf8) + 1;
  local_28.field_2.m_align = horizontalAlignment;
  QtPrivate::QGenericArrayOps<KDReports::ElementData>::emplace<KDReports::ElementData>
            ((QGenericArrayOps<KDReports::ElementData> *)this_00,(this_00->m_elements).d.size,
             &local_28);
  if (local_28.m_element != (Element *)0x0) {
    (*(local_28.m_element)->_vptr_Element[1])();
  }
  return;
}

Assistant:

void KDReports::Cell::addElement(const Element &element, Qt::AlignmentFlag horizontalAlignment)
{
    d->m_elements.append(KDReports::ElementData(element.clone(), horizontalAlignment));
}